

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

void __thiscall Units_compareCompatibleUnits_Test::TestBody(Units_compareCompatibleUnits_Test *this)

{
  element_type *peVar1;
  allocator<char> local_80 [8];
  char *local_78 [4];
  AssertHelper local_58 [8];
  AssertionResult gtest_ar_;
  UnitsPtr u2;
  UnitsPtr u1;
  
  libcellml::Units::create();
  peVar1 = u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_78,"u1",(allocator<char> *)&u2)
  ;
  libcellml::NamedEntity::setName((string *)peVar1);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_78,"milli",(allocator<char> *)&gtest_ar_);
  std::__cxx11::string::string<std::allocator<char>>((string *)&u2,"",local_80);
  libcellml::Units::addUnit
            ((StandardUnit)
             u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (string *)0x10,1.0,1.0,(string *)local_78);
  std::__cxx11::string::~string((string *)&u2);
  std::__cxx11::string::~string((string *)local_78);
  libcellml::Units::create();
  peVar1 = u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_78,"u2",(allocator<char> *)&gtest_ar_);
  libcellml::NamedEntity::setName((string *)peVar1);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_78,"",(allocator<char> *)&gtest_ar_);
  libcellml::Units::addUnit
            ((StandardUnit)
             u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0x10,1.0,1.0
             ,(string *)0x0);
  std::__cxx11::string::~string((string *)local_78);
  gtest_ar_.success_ = (bool)libcellml::Units::compatible((shared_ptr *)&u1,(shared_ptr *)&u2);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_78,&gtest_ar_.success_,
               "libcellml::Units::compatible(u1, u2)","false");
    testing::internal::AssertHelper::AssertHelper
              (local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x669,local_78[0]);
    testing::internal::AssertHelper::operator=(local_58,(Message *)local_80);
    testing::internal::AssertHelper::~AssertHelper(local_58);
    std::__cxx11::string::~string((string *)local_78);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_80);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Units, compareCompatibleUnits)
{
    libcellml::UnitsPtr u1 = libcellml::Units::create();
    u1->setName("u1");
    u1->addUnit(libcellml::Units::StandardUnit::LUX, "milli");

    libcellml::UnitsPtr u2 = libcellml::Units::create();
    u2->setName("u2");
    u2->addUnit(libcellml::Units::StandardUnit::LUX, 0, 1.0, 1.0);

    EXPECT_TRUE(libcellml::Units::compatible(u1, u2));
}